

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_font_atlas_init_default(nk_font_atlas *atlas)

{
  ulong uVar1;
  ulong uVar2;
  nk_font_atlas *__s;
  
  if (atlas != (nk_font_atlas *)0x0) {
    uVar1 = (ulong)atlas & 3;
    if (uVar1 == 0) {
      uVar2 = 400;
      __s = atlas;
    }
    else {
      memset(atlas,0,4 - uVar1);
      uVar2 = uVar1 | 0x18c;
      __s = (nk_font_atlas *)((4 - uVar1) + (long)atlas);
    }
    uVar1 = (ulong)((uint)uVar2 & 0xfffffffc);
    memset(__s,0,uVar1);
    if ((uVar2 & 3) != 0) {
      memset((void *)((long)(&__s->cursors[0].img + -3) + uVar1),0,uVar2 & 3);
    }
    (atlas->temporary).userdata.ptr = (void *)0x0;
    (atlas->temporary).alloc = nk_malloc;
    (atlas->temporary).free = nk_mfree;
    (atlas->permanent).userdata.ptr = (void *)0x0;
    (atlas->permanent).alloc = nk_malloc;
    (atlas->permanent).free = nk_mfree;
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_init_default(struct nk_font_atlas *atlas)
{
NK_ASSERT(atlas);
if (!atlas) return;
nk_zero_struct(*atlas);
atlas->temporary.userdata.ptr = 0;
atlas->temporary.alloc = nk_malloc;
atlas->temporary.free = nk_mfree;
atlas->permanent.userdata.ptr = 0;
atlas->permanent.alloc = nk_malloc;
atlas->permanent.free = nk_mfree;
}